

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9SetRegNum(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  uint local_30;
  int nRegNum;
  int c;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  local_30 = 0;
  Extra_UtilGetoptReset();
  while( true ) {
    iVar1 = Extra_UtilGetopt(argc,argv,"Nh");
    if (iVar1 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9SetRegNum(): There is no AIG.\n");
        return 1;
      }
      iVar1 = Gia_ManCiNum(pAbc->pGia);
      if (iVar1 <= (int)local_30) {
        Abc_Print(-1,
                  "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of CIs.\n"
                 );
        return 1;
      }
      iVar1 = Gia_ManCoNum(pAbc->pGia);
      if (iVar1 <= (int)local_30) {
        Abc_Print(-1,
                  "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of COs.\n"
                 );
        return 1;
      }
      pAbc->pGia->nRegs = local_30;
      return 0;
    }
    if (iVar1 != 0x4e) goto LAB_002a0318;
    if (argc <= globalUtilOptind) break;
    local_30 = atoi(argv[globalUtilOptind]);
    globalUtilOptind = globalUtilOptind + 1;
    if ((int)local_30 < 0) {
LAB_002a0318:
      Abc_Print(-2,"usage: &setregnum [-N num] [-h]\n");
      Abc_Print(-2,
                "\t         manually sets the number of registers to combine the last PI/PO pairs\n"
               );
      Abc_Print(-2,"\t-N num : set the number of registers to be the given number [default = %d]\n",
                (ulong)local_30);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  }
  Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
  goto LAB_002a0318;
}

Assistant:

int Abc_CommandAbc9SetRegNum( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c, nRegNum = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Nh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nRegNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nRegNum < 0 )
                goto usage;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9SetRegNum(): There is no AIG.\n" );
        return 1;
    }
    if ( nRegNum >= Gia_ManCiNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of CIs.\n" );
        return 1;
    }
    if ( nRegNum >= Gia_ManCoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9SetRegNum(): The number of registers should be less than the number of COs.\n" );
        return 1;
    }
    pAbc->pGia->nRegs = nRegNum;
    return 0;

usage:
    Abc_Print( -2, "usage: &setregnum [-N num] [-h]\n" );
    Abc_Print( -2, "\t         manually sets the number of registers to combine the last PI/PO pairs\n" );
    Abc_Print( -2, "\t-N num : set the number of registers to be the given number [default = %d]\n", nRegNum );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}